

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void __thiscall iutest::TestEnv::Variable::~Variable(Variable *this)

{
  std::__cxx11::string::~string((string *)&this->m_locale_ctype);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->m_ostream_formatter);
  TestEventRepeater::~TestEventRepeater(&(this->m_event_listeners).m_repeater);
  std::_Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::~_Vector_base
            (&(this->m_environment_list).
              super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>);
  std::__cxx11::string::~string((string *)&this->m_default_package_name);
  std::__cxx11::string::~string((string *)&(this->m_stream_result_to).m_value);
  std::__cxx11::string::~string((string *)&this->m_flagfile);
  std::__cxx11::string::~string((string *)&this->m_test_filter);
  std::__cxx11::string::~string((string *)&(this->m_output_option).m_value);
  return;
}

Assistant:

Variable()
            : m_random_seed(0)
            , m_current_random_seed(0)
            , m_before_origin_random_seed(0)
            , m_repeat_count(1)
            , m_testpartresult_reporter(NULL)
        {}